

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubGridIntersector1Pluecker<4,_true>_>::
     pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  undefined4 uVar24;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1068 [8];
  float fStack_1060;
  float fStack_105c;
  ulong local_1050;
  undefined1 (*local_1048) [16];
  ulong local_1040;
  long local_1038;
  long local_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar58 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar28 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar58 = ZEXT1664(auVar28);
  }
  local_1048 = (undefined1 (*) [16])local_f68;
  uVar24 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar24;
  local_f98._0_4_ = uVar24;
  local_f98._8_4_ = uVar24;
  local_f98._12_4_ = uVar24;
  auVar60 = ZEXT1664(local_f98);
  uVar24 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar24;
  local_fa8._0_4_ = uVar24;
  local_fa8._8_4_ = uVar24;
  local_fa8._12_4_ = uVar24;
  auVar61 = ZEXT1664(local_fa8);
  uVar24 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar24;
  local_fb8._0_4_ = uVar24;
  local_fb8._8_4_ = uVar24;
  local_fb8._12_4_ = uVar24;
  auVar62 = ZEXT1664(local_fb8);
  uVar24 = *(undefined4 *)&(context->query_radius).field_0;
  auVar28._4_4_ = uVar24;
  auVar28._0_4_ = uVar24;
  auVar28._8_4_ = uVar24;
  auVar28._12_4_ = uVar24;
  uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar29._4_4_ = uVar24;
  auVar29._0_4_ = uVar24;
  auVar29._8_4_ = uVar24;
  auVar29._12_4_ = uVar24;
  uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar35._4_4_ = uVar24;
  auVar35._0_4_ = uVar24;
  auVar35._8_4_ = uVar24;
  auVar35._12_4_ = uVar24;
  bVar15 = false;
  local_1050 = unaff_R15;
  do {
    local_fd8 = vsubps_avx(auVar60._0_16_,auVar28);
    fVar6 = auVar28._0_4_;
    fVar7 = auVar28._4_4_;
    fVar8 = auVar28._8_4_;
    fVar9 = auVar28._12_4_;
    local_fe8 = auVar60._0_4_ + fVar6;
    fStack_fe4 = auVar60._4_4_ + fVar7;
    fStack_fe0 = auVar60._8_4_ + fVar8;
    fStack_fdc = auVar60._12_4_ + fVar9;
    local_ff8 = vsubps_avx(auVar61._0_16_,auVar29);
    local_1008 = auVar61._0_4_ + auVar29._0_4_;
    fStack_1004 = auVar61._4_4_ + auVar29._4_4_;
    fStack_1000 = auVar61._8_4_ + auVar29._8_4_;
    fStack_ffc = auVar61._12_4_ + auVar29._12_4_;
    local_1018 = vsubps_avx(auVar62._0_16_,auVar35);
    local_1028._0_4_ = auVar62._0_4_ + auVar35._0_4_;
    local_1028._4_4_ = auVar62._4_4_ + auVar35._4_4_;
    local_1028._8_4_ = auVar62._8_4_ + auVar35._8_4_;
    local_1028._12_4_ = auVar62._12_4_ + auVar35._12_4_;
    local_f88._0_4_ = fVar6 * fVar6;
    local_f88._4_4_ = fVar7 * fVar7;
    local_f88._8_4_ = fVar8 * fVar8;
    local_f88._12_4_ = fVar9 * fVar9;
    auVar63 = ZEXT1664(local_f88);
    local_fc8 = auVar58._0_16_;
    do {
      do {
        do {
          if (local_1048 == (undefined1 (*) [16])local_f78) {
            return bVar15;
          }
          pauVar19 = local_1048 + -1;
          local_1048 = local_1048 + -1;
        } while (auVar58._0_4_ < *(float *)(*pauVar19 + 8));
        uVar22 = *(ulong *)*local_1048;
        pauVar19 = local_1048;
        do {
          auVar28 = auVar60._0_16_;
          auVar29 = auVar61._0_16_;
          auVar35 = auVar62._0_16_;
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar22 & 8) == 0) {
              auVar10 = vmaxps_avx(auVar28,*(undefined1 (*) [16])(uVar22 + 0x20));
              auVar10 = vminps_avx(auVar10,*(undefined1 (*) [16])(uVar22 + 0x30));
              auVar25 = vsubps_avx(auVar10,auVar28);
              auVar28 = vmaxps_avx(auVar29,*(undefined1 (*) [16])(uVar22 + 0x40));
              auVar10 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar22 + 0x50));
              auVar28 = vmaxps_avx(auVar35,*(undefined1 (*) [16])(uVar22 + 0x60));
              auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar22 + 0x70));
              auVar29 = vsubps_avx(auVar10,auVar29);
              auVar28 = vsubps_avx(auVar28,auVar35);
              local_1068._0_4_ =
                   auVar25._0_4_ * auVar25._0_4_ + auVar29._0_4_ * auVar29._0_4_ +
                   auVar28._0_4_ * auVar28._0_4_;
              local_1068._4_4_ =
                   auVar25._4_4_ * auVar25._4_4_ + auVar29._4_4_ * auVar29._4_4_ +
                   auVar28._4_4_ * auVar28._4_4_;
              fStack_1060 = auVar25._8_4_ * auVar25._8_4_ + auVar29._8_4_ * auVar29._8_4_ +
                            auVar28._8_4_ * auVar28._8_4_;
              fStack_105c = auVar25._12_4_ * auVar25._12_4_ + auVar29._12_4_ * auVar29._12_4_ +
                            auVar28._12_4_ * auVar28._12_4_;
              auVar28 = vcmpps_avx(_local_1068,auVar63._0_16_,2);
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x20),
                                   *(undefined1 (*) [16])(uVar22 + 0x30),2);
              auVar28 = vandps_avx(auVar28,auVar29);
LAB_012cc4c2:
              uVar24 = vmovmskps_avx(auVar28);
              local_1050 = CONCAT44((int)(local_1050 >> 0x20),uVar24);
            }
          }
          else if ((uVar22 & 8) == 0) {
            auVar10 = *(undefined1 (*) [16])(uVar22 + 0x20);
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x30);
            auVar11 = vmaxps_avx(auVar28,auVar10);
            auVar11 = vminps_avx(auVar11,auVar25);
            auVar11 = vsubps_avx(auVar11,auVar28);
            auVar28 = vmaxps_avx(auVar29,*(undefined1 (*) [16])(uVar22 + 0x40));
            auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar22 + 0x50));
            auVar29 = vsubps_avx(auVar28,auVar29);
            auVar28 = vmaxps_avx(auVar35,*(undefined1 (*) [16])(uVar22 + 0x60));
            auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar22 + 0x70));
            auVar28 = vsubps_avx(auVar28,auVar35);
            local_1068._4_4_ =
                 auVar11._4_4_ * auVar11._4_4_ + auVar29._4_4_ * auVar29._4_4_ +
                 auVar28._4_4_ * auVar28._4_4_;
            local_1068._0_4_ =
                 auVar11._0_4_ * auVar11._0_4_ + auVar29._0_4_ * auVar29._0_4_ +
                 auVar28._0_4_ * auVar28._0_4_;
            fStack_1060 = auVar11._8_4_ * auVar11._8_4_ + auVar29._8_4_ * auVar29._8_4_ +
                          auVar28._8_4_ * auVar28._8_4_;
            fStack_105c = auVar11._12_4_ * auVar11._12_4_ + auVar29._12_4_ * auVar29._12_4_ +
                          auVar28._12_4_ * auVar28._12_4_;
            auVar28 = vcmpps_avx(auVar10,auVar25,2);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x50),local_ff8,5);
            auVar28 = vandps_avx(auVar28,auVar29);
            auVar11._4_4_ = fStack_fe4;
            auVar11._0_4_ = local_fe8;
            auVar11._8_4_ = fStack_fe0;
            auVar11._12_4_ = fStack_fdc;
            auVar29 = vcmpps_avx(auVar10,auVar11,2);
            auVar10._4_4_ = fStack_1004;
            auVar10._0_4_ = local_1008;
            auVar10._8_4_ = fStack_1000;
            auVar10._12_4_ = fStack_ffc;
            auVar35 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x40),auVar10,2);
            auVar29 = vandps_avx(auVar35,auVar29);
            auVar35 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x70),local_1018,5);
            auVar28 = vandps_avx(auVar28,auVar35);
            auVar35 = vcmpps_avx(auVar25,local_fd8,5);
            auVar10 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x60),local_1028,2);
            auVar35 = vandps_avx(auVar10,auVar35);
            auVar29 = vandps_avx(auVar29,auVar35);
            auVar28 = vandps_avx(auVar29,auVar28);
            auVar28 = vpslld_avx(auVar28,0x1f);
            goto LAB_012cc4c2;
          }
          local_1048 = pauVar19;
          if ((uVar22 & 8) == 0) {
            if (local_1050 == 0) {
              iVar16 = 4;
            }
            else {
              uVar20 = uVar22 & 0xfffffffffffffff0;
              lVar21 = 0;
              if (local_1050 != 0) {
                for (; (local_1050 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              iVar16 = 0;
              uVar22 = *(ulong *)(uVar20 + lVar21 * 8);
              uVar18 = local_1050 - 1 & local_1050;
              if (uVar18 != 0) {
                uVar17 = *(uint *)(local_1068 + lVar21 * 4);
                lVar21 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar20 + lVar21 * 8);
                uVar3 = *(uint *)(local_1068 + lVar21 * 4);
                uVar18 = uVar18 - 1 & uVar18;
                if (uVar18 == 0) {
                  local_1048 = pauVar19 + 1;
                  if (uVar17 < uVar3) {
                    *(ulong *)*pauVar19 = uVar4;
                    *(uint *)(*pauVar19 + 8) = uVar3;
                  }
                  else {
                    *(ulong *)*pauVar19 = uVar22;
                    *(uint *)(*pauVar19 + 8) = uVar17;
                    uVar22 = uVar4;
                  }
                }
                else {
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = uVar22;
                  auVar28 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar17));
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = uVar4;
                  auVar29 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar3));
                  lVar21 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                    }
                  }
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
                  auVar10 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_1068 + lVar21 * 4)));
                  auVar35 = vpcmpgtd_avx(auVar29,auVar28);
                  uVar18 = uVar18 - 1 & uVar18;
                  if (uVar18 == 0) {
                    auVar25 = vpshufd_avx(auVar35,0xaa);
                    auVar35 = vblendvps_avx(auVar29,auVar28,auVar25);
                    auVar28 = vblendvps_avx(auVar28,auVar29,auVar25);
                    auVar29 = vpcmpgtd_avx(auVar10,auVar35);
                    auVar25 = vpshufd_avx(auVar29,0xaa);
                    auVar29 = vblendvps_avx(auVar10,auVar35,auVar25);
                    auVar35 = vblendvps_avx(auVar35,auVar10,auVar25);
                    auVar10 = vpcmpgtd_avx(auVar35,auVar28);
                    auVar25 = vpshufd_avx(auVar10,0xaa);
                    auVar10 = vblendvps_avx(auVar35,auVar28,auVar25);
                    auVar28 = vblendvps_avx(auVar28,auVar35,auVar25);
                    *pauVar19 = auVar28;
                    pauVar19[1] = auVar10;
                    uVar22 = auVar29._0_8_;
                    local_1048 = pauVar19 + 2;
                  }
                  else {
                    lVar21 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
                    auVar11 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_1068 + lVar21 * 4)));
                    auVar25 = vpshufd_avx(auVar35,0xaa);
                    auVar35 = vblendvps_avx(auVar29,auVar28,auVar25);
                    auVar28 = vblendvps_avx(auVar28,auVar29,auVar25);
                    auVar29 = vpcmpgtd_avx(auVar11,auVar10);
                    auVar25 = vpshufd_avx(auVar29,0xaa);
                    auVar29 = vblendvps_avx(auVar11,auVar10,auVar25);
                    auVar10 = vblendvps_avx(auVar10,auVar11,auVar25);
                    auVar25 = vpcmpgtd_avx(auVar10,auVar28);
                    auVar11 = vpshufd_avx(auVar25,0xaa);
                    auVar25 = vblendvps_avx(auVar10,auVar28,auVar11);
                    auVar28 = vblendvps_avx(auVar28,auVar10,auVar11);
                    auVar10 = vpcmpgtd_avx(auVar29,auVar35);
                    auVar11 = vpshufd_avx(auVar10,0xaa);
                    auVar10 = vblendvps_avx(auVar29,auVar35,auVar11);
                    auVar29 = vblendvps_avx(auVar35,auVar29,auVar11);
                    auVar35 = vpcmpgtd_avx(auVar25,auVar29);
                    auVar11 = vpshufd_avx(auVar35,0xaa);
                    auVar35 = vblendvps_avx(auVar25,auVar29,auVar11);
                    auVar29 = vblendvps_avx(auVar29,auVar25,auVar11);
                    *pauVar19 = auVar28;
                    pauVar19[1] = auVar29;
                    pauVar19[2] = auVar35;
                    uVar22 = auVar10._0_8_;
                    local_1048 = pauVar19 + 3;
                    iVar16 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
          pauVar19 = local_1048;
        } while (iVar16 == 0);
      } while ((iVar16 != 6) || (local_1038 = (ulong)((uint)uVar22 & 0xf) - 8, local_1038 == 0));
      bVar23 = 0;
      local_1030 = 0;
      local_1040 = uVar22 & 0xfffffffffffffff0;
      do {
        puVar1 = (ulong *)(local_1040 + 0x20 + local_1030 * 0x58);
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          fVar6 = *(float *)(puVar1 + 3);
          fVar7 = *(float *)((long)puVar1 + 0x24);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *puVar1;
          auVar28 = vpmovzxbd_avx(auVar26);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar31._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar31._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar31._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar31._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)((long)puVar1 + 4);
          auVar28 = vpmovzxbd_avx(auVar37);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar40._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar40._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar40._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar40._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          fVar6 = *(float *)((long)puVar1 + 0x1c);
          fVar7 = *(float *)(puVar1 + 5);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = puVar1[1];
          auVar28 = vpmovzxbd_avx(auVar49);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar50._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar50._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar50._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar50._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)((long)puVar1 + 0xc);
          auVar28 = vpmovzxbd_avx(auVar52);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar43._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar43._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar43._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar43._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          fVar6 = *(float *)(puVar1 + 4);
          fVar7 = *(float *)((long)puVar1 + 0x2c);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = puVar1[2];
          auVar28 = vpmovzxbd_avx(auVar55);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar56._0_4_ = auVar28._0_4_ * fVar7 + fVar6;
          auVar56._4_4_ = auVar28._4_4_ * fVar7 + fVar6;
          auVar56._8_4_ = auVar28._8_4_ * fVar7 + fVar6;
          auVar56._12_4_ = auVar28._12_4_ * fVar7 + fVar6;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)((long)puVar1 + 0x14);
          auVar28 = vpmovzxbd_avx(auVar59);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar46._0_4_ = fVar6 + auVar28._0_4_ * fVar7;
          auVar46._4_4_ = fVar6 + auVar28._4_4_ * fVar7;
          auVar46._8_4_ = fVar6 + auVar28._8_4_ * fVar7;
          auVar46._12_4_ = fVar6 + auVar28._12_4_ * fVar7;
          auVar28 = vmaxps_avx(auVar60._0_16_,auVar31);
          auVar28 = vminps_avx(auVar28,auVar40);
          auVar29 = vsubps_avx(auVar28,auVar60._0_16_);
          auVar28 = vmaxps_avx(auVar61._0_16_,auVar50);
          auVar28 = vminps_avx(auVar28,auVar43);
          auVar35 = vsubps_avx(auVar28,auVar61._0_16_);
          auVar28 = vmaxps_avx(auVar62._0_16_,auVar56);
          auVar28 = vminps_avx(auVar28,auVar46);
          auVar28 = vsubps_avx(auVar28,auVar62._0_16_);
          auVar44._0_4_ =
               auVar29._0_4_ * auVar29._0_4_ + auVar35._0_4_ * auVar35._0_4_ +
               auVar28._0_4_ * auVar28._0_4_;
          auVar44._4_4_ =
               auVar29._4_4_ * auVar29._4_4_ + auVar35._4_4_ * auVar35._4_4_ +
               auVar28._4_4_ * auVar28._4_4_;
          auVar44._8_4_ =
               auVar29._8_4_ * auVar29._8_4_ + auVar35._8_4_ * auVar35._8_4_ +
               auVar28._8_4_ * auVar28._8_4_;
          auVar44._12_4_ =
               auVar29._12_4_ * auVar29._12_4_ + auVar35._12_4_ * auVar35._12_4_ +
               auVar28._12_4_ * auVar28._12_4_;
          auVar29 = vcmpps_avx(auVar44,auVar63._0_16_,2);
          auVar28 = vcmpps_avx(auVar31,auVar40,2);
          auVar35 = vpminub_avx(auVar26,auVar37);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *puVar1;
          auVar35 = vpcmpeqb_avx(auVar27,auVar35);
          auVar35 = vpmovsxbd_avx(auVar35);
          auVar28 = vandps_avx(auVar28,auVar35);
          auVar28 = vandps_avx(auVar28,auVar29);
        }
        else {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *puVar1;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)puVar1 + 4);
          auVar28 = vpminub_avx(auVar32,auVar38);
          auVar28 = vpcmpeqb_avx(auVar32,auVar28);
          auVar35 = vpmovsxbd_avx(auVar28);
          fVar6 = *(float *)(puVar1 + 3);
          fVar7 = *(float *)((long)puVar1 + 0x24);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *puVar1;
          auVar28 = vpmovzxbd_avx(auVar33);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar34._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar34._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar34._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar34._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          auVar28 = vpmovzxbd_avx(auVar38);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar39._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar39._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar39._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar39._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          fVar6 = *(float *)((long)puVar1 + 0x1c);
          fVar7 = *(float *)(puVar1 + 5);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = puVar1[1];
          auVar28 = vpmovzxbd_avx(auVar47);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar48._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar48._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar48._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar48._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)((long)puVar1 + 0xc);
          auVar28 = vpmovzxbd_avx(auVar51);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar41._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar41._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar41._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar41._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          fVar6 = *(float *)(puVar1 + 4);
          fVar7 = *(float *)((long)puVar1 + 0x2c);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = puVar1[2];
          auVar28 = vpmovzxbd_avx(auVar53);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar54._0_4_ = fVar6 + fVar7 * auVar28._0_4_;
          auVar54._4_4_ = fVar6 + fVar7 * auVar28._4_4_;
          auVar54._8_4_ = fVar6 + fVar7 * auVar28._8_4_;
          auVar54._12_4_ = fVar6 + fVar7 * auVar28._12_4_;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)((long)puVar1 + 0x14);
          auVar28 = vpmovzxbd_avx(auVar57);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar45._0_4_ = fVar6 + auVar28._0_4_ * fVar7;
          auVar45._4_4_ = fVar6 + auVar28._4_4_ * fVar7;
          auVar45._8_4_ = fVar6 + auVar28._8_4_ * fVar7;
          auVar45._12_4_ = fVar6 + auVar28._12_4_ * fVar7;
          auVar28 = vcmpps_avx(auVar34,auVar39,2);
          auVar29 = vcmpps_avx(auVar39,local_fd8,5);
          auVar28 = vandps_avx(auVar29,auVar28);
          auVar13._4_4_ = fStack_fe4;
          auVar13._0_4_ = local_fe8;
          auVar13._8_4_ = fStack_fe0;
          auVar13._12_4_ = fStack_fdc;
          auVar29 = vcmpps_avx(auVar34,auVar13,2);
          auVar29 = vandps_avx(auVar29,auVar35);
          auVar28 = vandps_avx(auVar29,auVar28);
          auVar29 = vcmpps_avx(auVar41,local_ff8,5);
          auVar12._4_4_ = fStack_1004;
          auVar12._0_4_ = local_1008;
          auVar12._8_4_ = fStack_1000;
          auVar12._12_4_ = fStack_ffc;
          auVar35 = vcmpps_avx(auVar48,auVar12,2);
          auVar29 = vandps_avx(auVar35,auVar29);
          auVar35 = vcmpps_avx(auVar45,local_1018,5);
          auVar10 = vcmpps_avx(auVar54,local_1028,2);
          auVar29 = vandps_avx(auVar29,auVar10);
          auVar28 = vandps_avx(auVar28,auVar29);
          auVar28 = vandps_avx(auVar28,auVar35);
        }
        auVar28 = vpslld_avx(auVar28,0x1f);
        uVar17 = vmovmskps_avx(auVar28);
        if (uVar17 != 0) {
          uVar22 = (ulong)(uVar17 & 0xff);
          lVar21 = local_1030 * 0x58 + local_1040;
          do {
            lVar5 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar17 = *(uint *)(lVar21 + 0x50);
            uVar3 = *(uint *)(lVar21 + 4 + lVar5 * 8);
            this = (context->scene->geometries).items[uVar17].ptr;
            context->geomID = uVar17;
            context->primID = uVar3;
            bVar14 = Geometry::pointQuery(this,query,context);
            bVar23 = bVar23 | bVar14;
            uVar22 = uVar22 & uVar22 - 1;
          } while (uVar22 != 0);
        }
        local_1030 = local_1030 + 1;
        auVar60 = ZEXT1664(local_f98);
        auVar61 = ZEXT1664(local_fa8);
        auVar62 = ZEXT1664(local_fb8);
        auVar63 = ZEXT1664(local_f88);
      } while (local_1030 != local_1038);
      auVar58 = ZEXT1664(local_fc8);
    } while (bVar23 == 0);
    uVar24 = *(undefined4 *)&(context->query_radius).field_0;
    auVar28._4_4_ = uVar24;
    auVar28._0_4_ = uVar24;
    auVar28._8_4_ = uVar24;
    auVar28._12_4_ = uVar24;
    uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar29._4_4_ = uVar24;
    auVar29._0_4_ = uVar24;
    auVar29._8_4_ = uVar24;
    auVar29._12_4_ = uVar24;
    uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar35._4_4_ = uVar24;
    auVar35._0_4_ = uVar24;
    auVar35._8_4_ = uVar24;
    auVar35._12_4_ = uVar24;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar58 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar10 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar58 = ZEXT1664(auVar10);
    }
    bVar15 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }